

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

String __thiscall testing::internal::WideStringToUtf8(internal *this,wchar_t *str,int num_chars)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  size_t extraout_RDX;
  String SVar4;
  char local_1e8 [8];
  char buffer [32];
  wchar_t local_1b0;
  int local_1ac;
  UInt32 unicode_code_point;
  int i;
  stringstream stream;
  ostream local_198 [380];
  int local_1c;
  wchar_t *pwStack_18;
  int num_chars_local;
  wchar_t *str_local;
  
  local_1c = num_chars;
  pwStack_18 = str;
  str_local = (wchar_t *)this;
  if (num_chars == -1) {
    sVar2 = wcslen(str);
    local_1c = (int)sVar2;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&unicode_code_point);
  for (local_1ac = 0; (local_1ac < local_1c && (pwStack_18[local_1ac] != L'\0'));
      local_1ac = local_1ac + 1) {
    if ((local_1ac + 1 < local_1c) &&
       (bVar1 = IsUtf16SurrogatePair(pwStack_18[local_1ac],pwStack_18[(long)local_1ac + 1]), bVar1))
    {
      local_1b0 = CreateCodePointFromUtf16SurrogatePair
                            (pwStack_18[local_1ac],pwStack_18[(long)local_1ac + 1]);
      local_1ac = local_1ac + 1;
    }
    else {
      local_1b0 = pwStack_18[local_1ac];
    }
    pcVar3 = CodePointToUtf8(local_1b0,local_1e8);
    std::operator<<(local_198,pcVar3);
  }
  StringStreamToString(this,(stringstream *)&unicode_code_point);
  std::__cxx11::stringstream::~stringstream((stringstream *)&unicode_code_point);
  SVar4.length_ = extraout_RDX;
  SVar4.c_str_ = (char *)this;
  return SVar4;
}

Assistant:

String WideStringToUtf8(const wchar_t* str, int num_chars) {
  if (num_chars == -1)
    num_chars = static_cast<int>(wcslen(str));

  ::std::stringstream stream;
  for (int i = 0; i < num_chars; ++i) {
    UInt32 unicode_code_point;

    if (str[i] == L'\0') {
      break;
    } else if (i + 1 < num_chars && IsUtf16SurrogatePair(str[i], str[i + 1])) {
      unicode_code_point = CreateCodePointFromUtf16SurrogatePair(str[i],
                                                                 str[i + 1]);
      i++;
    } else {
      unicode_code_point = static_cast<UInt32>(str[i]);
    }

    char buffer[32];  // CodePointToUtf8 requires a buffer this big.
    stream << CodePointToUtf8(unicode_code_point, buffer);
  }
  return StringStreamToString(&stream);
}